

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O2

Map<String,_String> * Process::getEnvironmentVariables(void)

{
  char *in;
  char *pcVar1;
  usize length;
  long lVar2;
  Map<String,_String> *in_RDI;
  char *e;
  String value;
  String var;
  
  (in_RDI->_end).item = &in_RDI->endItem;
  (in_RDI->_begin).item = &in_RDI->endItem;
  in_RDI->root = (Item *)0x0;
  in_RDI->_size = 0;
  (in_RDI->endItem).key.data = &String::emptyData.super_Data;
  (in_RDI->endItem).value.data = &String::emptyData.super_Data;
  (in_RDI->endItem).parent = (Item *)0x0;
  (in_RDI->endItem).next = (Item *)0x0;
  (in_RDI->endItem).prev = (Item *)0x0;
  in_RDI->freeItem = (Item *)0x0;
  in_RDI->blocks = (ItemBlock *)0x0;
  for (lVar2 = 0; in = *(char **)(_environ + lVar2), in != (char *)0x0; lVar2 = lVar2 + 8) {
    pcVar1 = String::find(in,'=');
    if (pcVar1 != (char *)0x0) {
      var.data = &String::emptyData.super_Data;
      String::attach(&var,in,(long)pcVar1 - (long)in);
      value.data = &String::emptyData.super_Data;
      length = String::length(in + 1);
      String::attach(&value,in + 1,length);
      Map<String,_String>::insert(in_RDI,&var,&value);
      String::~String(&value);
      String::~String(&var);
    }
  }
  return in_RDI;
}

Assistant:

Map<String, String> Process::getEnvironmentVariables()
{
#ifdef _WIN32
  Map<String, String> result;
  LPTCH environmentStrings = GetEnvironmentStrings();
  if (!environmentStrings)
    return result;
  struct Guard
  {
    LPTCH _environmentStrings;
    ~Guard() { FreeEnvironmentStrings(_environmentStrings); }
  } guard = { environmentStrings };

  for (LPTCH i = environmentStrings; *i != '\0'; ++i)
  {
    String key;
    String value;

    for (; *i != '='; ++i)
      key += *i;
    ++i;
    for (; *i != '\0'; ++i)
        value += *i;

    if (key.isEmpty())
      continue;
    result.insert(key, value);
  }
  return result;
#else
  Map<String, String> result;
  for (size_t i = 0; environ[i]; ++i)
  {
    const char* e = environ[i];
    const char* x = String::find(e, '=');
    if (!x)
      continue;
    String var;
    var.attach(e, x - e);
    String value;
    ++e;
    value.attach(e, String::length(e));
    result.insert(var, value);
  }
  return result;
#endif
}